

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O2

void __thiscall PKCS12Test_TestWindows_Test::TestBody(PKCS12Test_TestWindows_Test *this)

{
  string data;
  Span<const_unsigned_char> local_28;
  
  GetTestData_abi_cxx11_((string *)&local_28,"crypto/pkcs8/test/windows.p12");
  TestImpl("Windows",local_28,"foo",(char *)0x0);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(PKCS12Test, TestWindows) {
  // windows.p12 is a dummy key and certificate exported from the certificate
  // manager on Windows 7. It has a friendlyName, but only on the key, where we
  // ignore it, and not the certificate.
  std::string data = GetTestData("crypto/pkcs8/test/windows.p12");
  TestImpl("Windows", bssl::StringAsBytes(data), kPassword, nullptr);
}